

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O1

ON_2dPoint __thiscall ON_SubDFaceParameter::QuadFaceParameters(ON_SubDFaceParameter *this)

{
  ushort uVar1;
  ushort uVar2;
  ON_2dPoint OVar3;
  double xx;
  double yy;
  ON_2dPoint local_18;
  
  uVar1 = (this->m_cdex).m_corner_index;
  uVar2 = (this->m_cdex).m_edge_count;
  if ((((uVar2 < 3 || uVar2 <= uVar1) || (this->m_s < 0.0)) || (0.5 < this->m_s)) ||
     (((this->m_t < 0.0 || (0.5 < this->m_t)) || (3 < uVar1 || uVar2 != 4)))) {
switchD_0060eecb_default:
    local_18.x = ON_2dPoint::NanPoint.x;
    local_18.y = ON_2dPoint::NanPoint.y;
  }
  else {
    switch(uVar1) {
    case 0:
      xx = this->m_s;
      yy = this->m_t;
      break;
    case 1:
      xx = 1.0 - this->m_t;
      yy = this->m_s;
      break;
    case 2:
      xx = 1.0 - this->m_s;
      yy = 1.0 - this->m_t;
      break;
    case 3:
      xx = this->m_t;
      yy = 1.0 - this->m_s;
      break;
    default:
      goto switchD_0060eecb_default;
    }
    ON_2dPoint::ON_2dPoint(&local_18,xx,yy);
  }
  OVar3.y = local_18.y;
  OVar3.x = local_18.x;
  return OVar3;
}

Assistant:

const ON_2dPoint ON_SubDFaceParameter::QuadFaceParameters() const
{
  if (IsSet() && m_cdex.IsQuadFace())
  {
    switch (m_cdex.CornerIndex())
    {
    case 0:
      return ON_2dPoint(m_s, m_t);
      break;
    case 1:
      return ON_2dPoint(1.0 - m_t, m_s);
      break;
    case 2:
      return ON_2dPoint(1.0 - m_s, 1.0 - m_t);
      break;
    case 3:
      return ON_2dPoint(m_t, 1.0 - m_s);
      break;
    }
  }
  return ON_2dPoint::NanPoint;
}